

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_service_skeleton(t_cpp_generator *this,t_service *tservice)

{
  int *piVar1;
  long lVar2;
  t_function *tfunction;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  ostream *poVar5;
  _func_int **pp_Var6;
  long *plVar7;
  t_cpp_generator *this_00;
  _Alloc_hider _Var8;
  pointer pptVar9;
  string svcname;
  string f_skeleton_name;
  string ns;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  ofstream_with_content_based_conditional_update f_skeleton;
  string local_3e8;
  char *local_3c8;
  long local_3c0;
  char local_3b8 [16];
  string local_3a8;
  string local_388;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  vector<t_function_*,_std::allocator<t_function_*>_> local_2c8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_3c8 = local_3b8;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,lVar2,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_308,this);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_3c8);
  pp_Var6 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var6) {
    local_1c0 = *pp_Var6;
    lStack_1b8 = plVar4[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var6;
    local_1d0._0_8_ = (_func_int **)*plVar4;
  }
  local_1d0._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1d0);
  local_368 = &local_358;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_358 = *plVar7;
    lStack_350 = plVar4[3];
  }
  else {
    local_358 = *plVar7;
    local_368 = (long *)*plVar4;
  }
  local_360 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  this_00 = (t_cpp_generator *)(tservice->super_t_type).program_;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"cpp","");
  t_program::get_namespace(&local_1f0,(t_program *)this_00,&local_210);
  namespace_prefix(&local_308,this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_3e8,(char *)local_368,(allocator *)&local_3a8);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,
             "// This autogenerated skeleton file illustrates how to build a server.",0x46);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"// You should copy it to another filename to avoid overwriting it.",0x42);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#include \"",10);
  get_include_prefix_abi_cxx11_
            (&local_3e8,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".h\"",3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"#include <thrift/protocol/TBinaryProtocol.h>",0x2c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"#include <thrift/server/TSimpleServer.h>",0x28);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"#include <thrift/transport/TServerSocket.h>",0x2b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"#include <thrift/transport/TBufferTransports.h>",0x2f);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"using namespace ::apache::thrift;",0x21);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"using namespace ::apache::thrift::protocol;",0x2b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"using namespace ::apache::thrift::transport;",0x2c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"using namespace ::apache::thrift::server;",0x29);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  if ((local_308._M_string_length != 0) &&
     (iVar3 = std::__cxx11::string::compare((char *)&local_308), iVar3 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"using namespace ",0x10)
    ;
    std::__cxx11::string::string
              ((string *)&local_3e8,(string *)&local_308,0,local_308._M_string_length - 2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Handler : virtual public ",0x19);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"If {",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Handler() {",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"  // Your initialization goes here",0x22);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_2c8,&tservice->functions_)
  ;
  pptVar9 = local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
                (this,(ostream *)local_1d0,*pptVar9);
      t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,local_3e8._M_dataplus._M_p,local_3e8._M_string_length
                         );
      tfunction = *pptVar9;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"","");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"","");
      function_signature(&local_3a8,this,tfunction,&local_2e8,&local_2b0,true);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_388._M_dataplus._M_p,local_388._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  // Your implementation goes here",0x22);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_328._M_dataplus._M_p,local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  printf(\"",10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\n\");",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_348._M_dataplus._M_p,local_348._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"};",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"int main(int argc, char **argv) {",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"int port = 9090;",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::std::shared_ptr<",0x12);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Handler> handler(new ",0x15);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Handler());",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::std::shared_ptr<TProcessor> processor(new ",0x2c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c8,local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Processor(handler));",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_328._M_dataplus._M_p,local_328._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));",
             0x4d);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_348._M_dataplus._M_p,local_348._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());"
             ,0x57);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());",
             0x52);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);",
             0x54);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"server.serve();",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return 0;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  _Var8 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)_Var8._M_p);
  if (local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates how to build a server." << endl
             << "// You should copy it to another filename to avoid overwriting it." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/server/TSimpleServer.h>" << endl
             << "#include <thrift/transport/TServerSocket.h>" << endl
             << "#include <thrift/transport/TBufferTransports.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::server;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "Handler> handler(new " << svcname << "Handler());" << endl << indent()
      << "::std::shared_ptr<TProcessor> processor(new " << svcname << "Processor(handler));" << endl
      << indent() << "::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));"
      << endl << indent()
      << "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl << endl << indent()
      << "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;

  // Close the files
  f_skeleton.close();
}